

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

Gateway * __thiscall prometheus::Gateway::getUri(Gateway *this,CollectableEntry *collectable)

{
  ostream *poVar1;
  long in_RDX;
  stringstream local_1a8 [8];
  stringstream uri;
  ostream local_198 [376];
  long local_20;
  CollectableEntry *collectable_local;
  Gateway *this_local;
  
  local_20 = in_RDX;
  collectable_local = collectable;
  this_local = this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = ::std::operator<<(local_198,(string *)collectable);
  poVar1 = ::std::operator<<(poVar1,(string *)&collectable->field_0x20);
  ::std::operator<<(poVar1,(string *)(local_20 + 0x10));
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string Gateway::getUri(const CollectableEntry& collectable) const {
  std::stringstream uri;
  uri << jobUri_ << labels_ << collectable.second;

  return uri.str();
}